

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::Matrix::makeRotation(Matrix *dst,Quat *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = (float)q->x;
  fVar1 = (float)q->y;
  fVar4 = (float)q->z;
  fVar2 = (float)q->w;
  fVar5 = fVar1 * fVar1 + fVar4 * fVar4;
  (dst->right).x = (float32)(1.0 - (fVar5 + fVar5));
  fVar5 = fVar3 * fVar1 + fVar4 * fVar2;
  (dst->right).y = (float32)(fVar5 + fVar5);
  fVar5 = fVar3 * fVar4 - fVar1 * fVar2;
  (dst->right).z = (float32)(fVar5 + fVar5);
  fVar5 = fVar3 * fVar1 - fVar4 * fVar2;
  (dst->up).x = (float32)(fVar5 + fVar5);
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3;
  (dst->up).y = (float32)(1.0 - (fVar5 + fVar5));
  fVar5 = fVar1 * fVar4 + fVar3 * fVar2;
  (dst->up).z = (float32)(fVar5 + fVar5);
  fVar5 = fVar1 * fVar2 + fVar3 * fVar4;
  (dst->at).x = (float32)(fVar5 + fVar5);
  fVar4 = fVar1 * fVar4 - fVar3 * fVar2;
  (dst->at).y = (float32)(fVar4 + fVar4);
  fVar3 = fVar1 * fVar1 + fVar3 * fVar3;
  (dst->at).z = (float32)(1.0 - (fVar3 + fVar3));
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  *(undefined8 *)&(dst->pos).z = 0;
  dst->flags = 3;
  dst->pad2 = 0;
  dst->pad1 = 0;
  return;
}

Assistant:

void
Matrix::makeRotation(Matrix *dst, const Quat &q)
{
	float xx = q.x*q.x;
	float yy = q.y*q.y;
	float zz = q.z*q.z;
	float yz = q.y*q.z;
	float zx = q.z*q.x;
	float xy = q.x*q.y;
	float wx = q.w*q.x;
	float wy = q.w*q.y;
	float wz = q.w*q.z;

	dst->right.x = 1.0f - 2.0f*(yy + zz);
	dst->right.y =        2.0f*(xy + wz);
	dst->right.z =        2.0f*(zx - wy);
	dst->up.x =        2.0f*(xy - wz);
	dst->up.y = 1.0f - 2.0f*(xx + zz);
	dst->up.z =        2.0f*(yz + wx);
	dst->at.x =        2.0f*(zx + wy);
	dst->at.y =        2.0f*(yz - wx);
	dst->at.z = 1.0f - 2.0f*(xx + yy);
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	dst->flags = TYPEORTHONORMAL;
	dst->pad1 = dst->pad2 = dst->pad3 = 0;
}